

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns_constraints.c
# Opt level: O0

void PrintOutput1(sunrealtype time,sunrealtype t,N_Vector y,N_Vector yB)

{
  long *in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  printf("--------------------------------------------------------\n");
  printf("returned t: %12.4e\n",in_XMM0_Qa);
  printf("tout:       %12.4e\n",in_XMM1_Qa);
  printf("lambda(t):  %12.4e %12.4e %12.4e\n",**(undefined8 **)(*in_RSI + 0x10),
         *(undefined8 *)(*(long *)(*in_RSI + 0x10) + 8),
         *(undefined8 *)(*(long *)(*in_RSI + 0x10) + 0x10));
  printf("y(t):       %12.4e %12.4e %12.4e\n",**(undefined8 **)(*in_RDI + 0x10),
         *(undefined8 *)(*(long *)(*in_RDI + 0x10) + 8),
         *(undefined8 *)(*(long *)(*in_RDI + 0x10) + 0x10));
  printf("--------------------------------------------------------\n\n");
  return;
}

Assistant:

static void PrintOutput1(sunrealtype time, sunrealtype t, N_Vector y, N_Vector yB)
{
  printf("--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("returned t: %12.4Le\n", time);
  printf("tout:       %12.4Le\n", t);
  printf("lambda(t):  %12.4Le %12.4Le %12.4Le\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t):       %12.4Le %12.4Le %12.4Le\n", Ith(y, 1), Ith(y, 2),
         Ith(y, 3));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("returned t: %12.4e\n", time);
  printf("tout:       %12.4e\n", t);
  printf("lambda(t):  %12.4e %12.4e %12.4e\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t):       %12.4e %12.4e %12.4e\n", Ith(y, 1), Ith(y, 2), Ith(y, 3));
#else
  printf("returned t: %12.4e\n", time);
  printf("tout:       %12.4e\n", t);
  printf("lambda(t):  %12.4e %12.4e %12.4e\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
  printf("y(t)      : %12.4e %12.4e %12.4e\n", Ith(y, 1), Ith(y, 2), Ith(y, 3));
#endif
  printf("--------------------------------------------------------\n\n");
}